

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Vec_Vec_t *
Ssw_ManFindDirectImplications(Aig_Man_t *p,int nFrames,int nConfs,int nProps,int fVerbose)

{
  int iVar1;
  int *piVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  Vec_Vec_t *p_00;
  void **ppvVar6;
  Aig_Man_t *p_01;
  Cnf_Dat_t *p_02;
  sat_solver *s;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint local_64;
  
  p_00 = (Vec_Vec_t *)malloc(0x10);
  local_64 = nFrames - 1;
  uVar8 = 8;
  if (6 < local_64) {
    uVar8 = (ulong)(uint)nFrames;
  }
  p_00->nSize = 0;
  iVar5 = (int)uVar8;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)iVar5 << 3);
  }
  p_00->pArray = ppvVar6;
  p_01 = Saig_ManUnrollCOI(p,nFrames);
  if (p_01->nObjs[3] != 1) {
    __assert_fail("Aig_ManCoNum(pFrames) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                  ,0x244,"Vec_Vec_t *Ssw_ManFindDirectImplications(Aig_Man_t *, int, int, int, int)"
                 );
  }
  p_02 = Cnf_DeriveSimple(p_01,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_02,1,0);
  if (s != (sat_solver *)0x0) {
    Aig_ManIncrementTravId(p);
    if (0 < nFrames) {
      iVar5 = 0;
      do {
        pVVar7 = p->vObjs;
        if (0 < pVVar7->nSize) {
          lVar12 = 0;
          uVar10 = local_64;
          do {
            piVar2 = (int *)pVVar7->pArray[lVar12];
            if ((((piVar2 != (int *)0x0) && ((piVar2[6] & 7U) < 7)) &&
                ((100U >> (piVar2[6] & 7U) & 1) != 0)) && (piVar2[8] != p->nTravIds)) {
              pAVar3 = p->pObjCopies[(int)uVar10];
              if ((-1 < p_02->pVarNums[*(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24)]) &&
                 (iVar4 = sat_solver_get_var_value
                                    (s,p_02->pVarNums
                                       [*(int *)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x24)]),
                 iVar4 != 0)) {
                iVar1 = p->nTravIds;
                piVar2[8] = iVar1;
                if ((((uint)*(undefined8 *)(piVar2 + 6) & 7) == 2) && (p->nTruePis <= *piVar2)) {
                  if (*piVar2 < p->nTruePis) {
                    __assert_fail("Saig_ObjIsLo(p, pObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                                  ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
                  }
                  uVar9 = (*piVar2 - p->nTruePis) + p->nTruePos;
                  if (((int)uVar9 < 0) || (p->vCos->nSize <= (int)uVar9)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  *(int *)((*(ulong *)((long)p->vCos->pArray[uVar9] + 8) & 0xfffffffffffffffe) +
                          0x20) = iVar1;
                }
                Vec_VecPush(p_00,iVar5,
                            (void *)((ulong)((uint)pAVar3 & 1) ^ (ulong)piVar2 ^ (ulong)(iVar4 == 1)
                                    ));
              }
            }
            lVar12 = lVar12 + 1;
            pVVar7 = p->vObjs;
            uVar8 = (ulong)pVVar7->nSize;
            uVar10 = uVar10 + nFrames;
          } while (lVar12 < (long)uVar8);
        }
        iVar5 = iVar5 + 1;
        local_64 = local_64 - 1;
      } while (iVar5 != nFrames);
    }
    sat_solver_delete(s);
  }
  Aig_ManStop(p_01);
  Cnf_DataFree(p_02);
  iVar5 = (int)uVar8;
  if (fVerbose != 0) {
    iVar4 = p_00->nSize;
    uVar11 = (ulong)iVar4;
    if ((long)uVar11 < 1) {
      uVar13 = 0;
    }
    else {
      uVar8 = 0;
      uVar13 = 0;
      do {
        uVar13 = (ulong)(uint)((int)uVar13 + *(int *)((long)p_00->pArray[uVar8] + 4));
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
    }
    printf("Found %3d candidates.\n",uVar13);
    iVar5 = (int)uVar8;
    if (0 < iVar4) {
      ppvVar6 = p_00->pArray;
      uVar13 = 0;
      do {
        printf("Level %d. Cands  =%d    ",uVar13 & 0xffffffff,
               (ulong)*(uint *)((long)ppvVar6[uVar13] + 4));
        putchar(10);
        iVar5 = (int)uVar8;
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  if (p->pObjCopies != (Aig_Obj_t **)0x0) {
    free(p->pObjCopies);
    p->pObjCopies = (Aig_Obj_t **)0x0;
  }
  Saig_ManFilterUsingInd(p,p_00,nConfs,iVar5,fVerbose);
  iVar5 = p_00->nSize;
  uVar8 = (ulong)iVar5;
  if (0 < (long)uVar8) {
    uVar11 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *(int *)((long)p_00->pArray[uVar11] + 4);
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
    if (iVar4 != 0) {
      if (iVar5 < 1) {
        uVar11 = 0;
      }
      else {
        uVar13 = 0;
        uVar11 = 0;
        do {
          uVar11 = (ulong)(uint)((int)uVar11 + *(int *)((long)p_00->pArray[uVar13] + 4));
          uVar13 = uVar13 + 1;
        } while (uVar8 != uVar13);
      }
      printf("Found %3d constraints after filtering.\n",uVar11);
    }
  }
  if ((fVerbose != 0) && (0 < iVar5)) {
    ppvVar6 = p_00->pArray;
    uVar11 = 0;
    do {
      printf("Level %d. Constr =%d    ",uVar11 & 0xffffffff,
             (ulong)*(uint *)((long)ppvVar6[uVar11] + 4));
      putchar(10);
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Ssw_ManFindDirectImplications( Aig_Man_t * p, int nFrames, int nConfs, int nProps, int fVerbose )
{
    Vec_Vec_t * vCands = NULL;
    Vec_Ptr_t * vNodes;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pRepr, * pReprR;
    int i, f, k, value;
    vCands = Vec_VecAlloc( nFrames );

    // perform unrolling
    pFrames = Saig_ManUnrollCOI( p, nFrames );
    assert( Aig_ManCoNum(pFrames) == 1 );
    // start the SAT solver
    pCnf = Cnf_DeriveSimple( pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat != NULL )
    {
        Aig_ManIncrementTravId( p );
        for ( f = 0; f < nFrames; f++ )
        {
            Aig_ManForEachObj( p, pObj, i )
            {
                if ( !Aig_ObjIsCand(pObj) )
                    continue;
                if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                    continue;
                // get the node from timeframes
                pRepr  = p->pObjCopies[nFrames*i + nFrames-1-f];
                pReprR = Aig_Regular(pRepr);
                if ( pCnf->pVarNums[Aig_ObjId(pReprR)] < 0 )
                    continue;
//                value = pSat->assigns[ pCnf->pVarNums[Aig_ObjId(pReprR)] ];
                value = sat_solver_get_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pReprR)] );
                if ( value == l_Undef )
                    continue;
                // label this node as taken
                Aig_ObjSetTravIdCurrent(p, pObj);
                if ( Saig_ObjIsLo(p, pObj) )
                    Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(Saig_ObjLoToLi(p, pObj)) );
                // remember the node
                Vec_VecPush( vCands, f, Aig_NotCond( pObj, (value == l_True) ^ Aig_IsComplement(pRepr) ) );
        //        printf( "%s%d ", (value == l_False)? "":"!", i );
            }
        }
    //    printf( "\n" );
        sat_solver_delete( pSat );
    }
    Aig_ManStop( pFrames );
    Cnf_DataFree( pCnf );

    if ( fVerbose )
    {
        printf( "Found %3d candidates.\n", Vec_VecSizeSize(vCands) );
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Cands  =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    ABC_FREE( p->pObjCopies );
    Saig_ManFilterUsingInd( p, vCands, nConfs, nProps, fVerbose );
    if ( Vec_VecSizeSize(vCands) )
        printf( "Found %3d constraints after filtering.\n", Vec_VecSizeSize(vCands) );
    if ( fVerbose )
    {
        Vec_VecForEachLevel( vCands, vNodes, k )
        {
            printf( "Level %d. Constr =%d    ", k, Vec_PtrSize(vNodes) );
//            Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
//                printf( "%d:%s%d ", k, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
            printf( "\n" );
        }
    }

    return vCands;
}